

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O0

void div_type(http_request *req)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int local_18;
  int dot;
  int len;
  http_request *req_local;
  
  iVar1 = strcmp(req->uri,"/");
  if (iVar1 == 0) {
    req->f_type = ROOT;
  }
  else {
    sVar2 = strlen(req->file);
    local_18 = (int)sVar2;
    do {
      local_18 = local_18 + -1;
      bVar3 = false;
      if (-1 < local_18) {
        bVar3 = req->file[local_18] != '.';
      }
    } while (bVar3);
    if (local_18 < 1) {
      req->f_type = NDIR;
    }
    else {
      req->f_type = NFILE;
    }
  }
  return;
}

Assistant:

void div_type(struct http_request *req) {
    if(strcmp(req->uri, "/") == 0){
        req->f_type = ROOT;
        return;
    }
    int len = 0;
    len = (int)strlen(req->file);
    int dot = len - 1;
    while( dot >= 0 && req->file[dot] != '.'){
        dot--;
    }
    if(dot <= 0){
        req->f_type = NDIR;
    } else {
        req->f_type = NFILE;
    }
}